

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.cpp
# Opt level: O1

void * __thiscall phyr::MemoryPool::alloc(MemoryPool *this,size_t byteCount)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  MemoryPool *pMVar5;
  void *ptr;
  void *local_20;
  
  uVar4 = byteCount + 0xf & 0xfffffffffffffff0;
  if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + uVar4) {
    stash(this);
    pMVar5 = this + 0x28;
    do {
      pMVar5 = *(MemoryPool **)pMVar5;
      if (pMVar5 == this + 0x28) goto LAB_0010517e;
      uVar3 = *(ulong *)(pMVar5 + 0x18);
    } while (uVar3 < uVar4);
    *(undefined8 *)(this + 0x20) = *(undefined8 *)(pMVar5 + 0x10);
    *(ulong *)(this + 0x18) = uVar3;
    *(long *)(this + 0x38) = *(long *)(this + 0x38) + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pMVar5);
LAB_0010517e:
    if (*(long *)(this + 0x20) == 0) {
      uVar3 = *(ulong *)this;
      if (*(ulong *)this < uVar4) {
        uVar3 = uVar4;
      }
      *(ulong *)(this + 0x18) = uVar3;
      iVar2 = posix_memalign(&local_20,(long)PhyRayL1CacheLineSize,uVar3);
      if (iVar2 != 0) {
        local_20 = (void *)0x0;
      }
      *(void **)(this + 0x20) = local_20;
      *(long *)(this + 8) = *(long *)(this + 8) + *(long *)(this + 0x18);
    }
    *(undefined8 *)(this + 0x10) = 0;
  }
  lVar1 = *(long *)(this + 0x10);
  *(ulong *)(this + 0x10) = uVar4 + lVar1;
  return (void *)(*(long *)(this + 0x20) + lVar1);
}

Assistant:

void* MemoryPool::alloc(size_t byteCount) {
    // Align {size} with cache line size
    // Optimized alignment calculation, as {MachineAlignment} is a power of 2
    byteCount = (byteCount + MachineAlignment - 1) & ~(MachineAlignment - 1);

    // Check if size requirement is more than what is curently available
    if (curBlockOffset + byteCount > curAllocSize) {
        // Store current block usage data
        stash();

        // Check free blocks for memory
        for (auto it = freeBlocks.begin(); it != freeBlocks.end(); it++) {
            if (it->second >= byteCount) {
                blockPtr = it->first; curAllocSize = it->second;
                // Remove this block from the free set
                freeBlocks.erase(it);
                break;
            }
        }

        // If a block has not yet been found, allocate new
        if (!blockPtr) {
            // Ensure minimum of {blockSize} bytes per block
            curAllocSize = std::max(byteCount, blockSize);
            blockPtr = allocAligned<uint8_t>(curAllocSize);
            // Increment pool size stat
            totalAllocSize += curAllocSize;
        }

        // New memory block allocated, reset block offset
        curBlockOffset = 0;
    }

    void* ptr = blockPtr + curBlockOffset;
    curBlockOffset += byteCount;
    return ptr;
}